

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O2

void bsPutUInt32(EState *s,UInt32 u)

{
  bsW(s,8,u >> 0x18);
  bsW(s,8,u >> 0x10 & 0xff);
  bsW(s,8,u >> 8 & 0xff);
  bsW(s,8,u & 0xff);
  return;
}

Assistant:

static
void bsPutUInt32 ( EState* s, UInt32 u )
{
   bsW ( s, 8, (u >> 24) & 0xffL );
   bsW ( s, 8, (u >> 16) & 0xffL );
   bsW ( s, 8, (u >>  8) & 0xffL );
   bsW ( s, 8,  u        & 0xffL );
}